

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  PrimaryInstanceWidget *this;
  SecondaryInstanceWidget *this_00;
  SecondaryInstanceWidget *siw;
  Object local_68 [8];
  PrimaryInstanceWidget *local_60;
  PrimaryInstanceWidget *piw;
  QWidget *widget;
  KDSingleApplication local_40 [8];
  KDSingleApplication kdsa;
  QApplication local_28 [8];
  QApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QApplication::QApplication(local_28,(int *)&argv_local,argv,0x60204);
  KDSingleApplication::KDSingleApplication(local_40,(QObject *)0x0);
  bVar1 = KDSingleApplication::isPrimaryInstance();
  if ((bVar1 & 1) == 0) {
    this_00 = (SecondaryInstanceWidget *)operator_new(0x38);
    SecondaryInstanceWidget::SecondaryInstanceWidget(this_00,local_40,(QWidget *)0x0);
    piw = (PrimaryInstanceWidget *)this_00;
  }
  else {
    this = (PrimaryInstanceWidget *)operator_new(0x30);
    PrimaryInstanceWidget::PrimaryInstanceWidget(this,(QWidget *)0x0);
    local_60 = this;
    QObject::
    connect<void(KDSingleApplication::*)(QByteArray_const&),void(PrimaryInstanceWidget::*)(QByteArray_const&)>
              (local_68,(offset_in_KDSingleApplication_to_subr)local_40,
               (Object *)KDSingleApplication::messageReceived,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    piw = local_60;
  }
  QWidget::setAttribute((WidgetAttribute)piw,true);
  QWidget::show();
  argv_local._4_4_ = QApplication::exec();
  KDSingleApplication::~KDSingleApplication(local_40);
  QApplication::~QApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    KDSingleApplication kdsa;

    QWidget *widget;

    if (kdsa.isPrimaryInstance()) {
        PrimaryInstanceWidget *piw = new PrimaryInstanceWidget;
        QObject::connect(&kdsa, &KDSingleApplication::messageReceived,
                         piw, &PrimaryInstanceWidget::addMessage);

        widget = piw;
    } else {
        SecondaryInstanceWidget *siw = new SecondaryInstanceWidget(&kdsa);
        widget = siw;
    }

    widget->setAttribute(Qt::WA_DeleteOnClose);
    widget->show();

    return app.exec();
}